

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeInitDrivers
          (uint32_t *pCount,ze_driver_handle_t *phDrivers,ze_init_driver_type_desc_t *desc)

{
  int iVar1;
  char *pcVar2;
  ze_driver_handle_t p_Var3;
  bool bVar4;
  ulong local_68;
  size_t i;
  string local_58 [8];
  string driver_type;
  ze_pfnInitDrivers_t pfnInitDrivers;
  ze_result_t result;
  ze_init_driver_type_desc_t *desc_local;
  ze_driver_handle_t *phDrivers_local;
  uint32_t *pCount_local;
  
  pfnInitDrivers._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c1c8 == (code *)0x0) {
    getenv_string_abi_cxx11_((char *)local_58);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iVar1 = strcmp(pcVar2,"GPU");
    if ((iVar1 == 0) && ((desc->flags & 1) == 0)) {
      pCount_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
      bVar4 = true;
    }
    else {
      pcVar2 = (char *)std::__cxx11::string::c_str();
      iVar1 = strcmp(pcVar2,"NPU");
      if ((iVar1 == 0) && ((desc->flags & 2) == 0)) {
        pCount_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
        bVar4 = true;
      }
      else {
        if (phDrivers == (ze_driver_handle_t *)0x0) {
          *pCount = 1;
        }
        local_68 = 0;
        while( true ) {
          bVar4 = false;
          if (phDrivers != (ze_driver_handle_t *)0x0) {
            bVar4 = local_68 < *pCount;
          }
          if (!bVar4) break;
          p_Var3 = (ze_driver_handle_t)context_t::get((context_t *)&context);
          phDrivers[local_68] = p_Var3;
          local_68 = local_68 + 1;
        }
        bVar4 = false;
      }
    }
    std::__cxx11::string::~string(local_58);
    if (bVar4) {
      return pCount_local._4_4_;
    }
  }
  else {
    pfnInitDrivers._4_4_ = (*DAT_0011c1c8)(pCount,phDrivers,desc);
  }
  return pfnInitDrivers._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeInitDrivers(
        uint32_t* pCount,                               ///< [in,out] pointer to the number of driver instances.
                                                        ///< if count is zero, then the loader shall update the value with the
                                                        ///< total number of drivers available.
                                                        ///< if count is greater than the number of drivers available, then the
                                                        ///< loader shall update the value with the correct number of drivers available.
        ze_driver_handle_t* phDrivers,                  ///< [in,out][optional][range(0, *pCount)] array of driver instance handles.
                                                        ///< if count is less than the number of drivers available, then the loader
                                                        ///< shall only retrieve that number of drivers.
        ze_init_driver_type_desc_t* desc                ///< [in] descriptor containing the driver type initialization details
                                                        ///< including ::ze_init_driver_type_flag_t combinations.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnInitDrivers = context.zeDdiTable.Global.pfnInitDrivers;
        if( nullptr != pfnInitDrivers )
        {
            result = pfnInitDrivers( pCount, phDrivers, desc );
        }
        else
        {
            // generic implementation
            auto driver_type = getenv_string( "ZEL_TEST_NULL_DRIVER_TYPE" );
            if (std::strcmp(driver_type.c_str(), "GPU") == 0) {
                if (!(desc->flags & ZE_INIT_DRIVER_TYPE_FLAG_GPU)) {
                    return ZE_RESULT_ERROR_UNINITIALIZED;
                }
            }
            if (std::strcmp(driver_type.c_str(), "NPU") == 0) {
                if (!(desc->flags & ZE_INIT_DRIVER_TYPE_FLAG_NPU)) {
                    return ZE_RESULT_ERROR_UNINITIALIZED;
                }
            }

            if (phDrivers == nullptr) {
                *pCount = 1;
            }
            for( size_t i = 0; ( nullptr != phDrivers ) && ( i < *pCount ); ++i )
                phDrivers[ i ] = reinterpret_cast<ze_driver_handle_t>( context.get() );

        }

        return result;
    }